

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void __thiscall
fmt::v7::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,emphasis em)

{
  uint8_t uVar1;
  int i;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint8_t em_codes [4];
  
  em_codes[0] = '\0';
  em_codes[1] = '\0';
  em_codes[2] = '\0';
  em_codes[3] = '\0';
  bVar4 = (em & bold) != 0;
  if (bVar4) {
    em_codes[0] = '\x01';
    em_codes[1] = '\0';
    em_codes[2] = '\0';
    em_codes[3] = '\0';
  }
  em_codes[1] = '\0';
  em_codes[2] = '\0';
  em_codes[3] = '\0';
  em_codes[0] = bVar4;
  if ((em & italic) != 0) {
    em_codes[1] = '\x03';
    em_codes[2] = '\0';
    em_codes[3] = '\0';
  }
  if ((em & underline) != 0) {
    em_codes[2] = '\x04';
    em_codes[3] = '\0';
  }
  if ((em & strikethrough) != 0) {
    em_codes[3] = '\t';
  }
  lVar2 = 0;
  lVar3 = 0;
  do {
    uVar1 = em_codes[lVar2];
    if (uVar1 != '\0') {
      (this->buffer + lVar3)[0] = '\x1b';
      (this->buffer + lVar3)[1] = '[';
      this->buffer[lVar3 + 2] = uVar1 + '0';
      this->buffer[lVar3 + 3] = 'm';
      lVar3 = lVar3 + 4;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  this->buffer[lVar3] = '\0';
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(emphasis em) FMT_NOEXCEPT {
    uint8_t em_codes[4] = {};
    uint8_t em_bits = static_cast<uint8_t>(em);
    if (em_bits & static_cast<uint8_t>(emphasis::bold)) em_codes[0] = 1;
    if (em_bits & static_cast<uint8_t>(emphasis::italic)) em_codes[1] = 3;
    if (em_bits & static_cast<uint8_t>(emphasis::underline)) em_codes[2] = 4;
    if (em_bits & static_cast<uint8_t>(emphasis::strikethrough))
      em_codes[3] = 9;

    size_t index = 0;
    for (int i = 0; i < 4; ++i) {
      if (!em_codes[i]) continue;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');
      buffer[index++] = static_cast<Char>('0' + em_codes[i]);
      buffer[index++] = static_cast<Char>('m');
    }
    buffer[index++] = static_cast<Char>(0);
  }